

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::PrintGeneratorList(cmake *this)

{
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> generators;
  cmDocumentation doc;
  
  cmDocumentation::cmDocumentation(&doc);
  generators.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  generators.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  generators.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetGeneratorDocumentation(this,&generators);
  cmDocumentation::AppendSection(&doc,"Generators",&generators);
  std::operator<<((ostream *)&std::cerr,"\n");
  cmDocumentation::PrintDocumentation(&doc,ListGenerators,(ostream *)&std::cerr);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector(&generators);
  cmDocumentation::~cmDocumentation(&doc);
  return;
}

Assistant:

void cmake::PrintGeneratorList()
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDocumentation doc;
  std::vector<cmDocumentationEntry> generators;
  this->GetGeneratorDocumentation(generators);
  doc.AppendSection("Generators", generators);
  std::cerr << "\n";
  doc.PrintDocumentation(cmDocumentation::ListGenerators, std::cerr);
#endif
}